

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O1

Point astar::operator+(Point *aPoint,Point *bPoint)

{
  uint uVar1;
  uint uVar2;
  LogStream *pLVar3;
  Point PVar4;
  LogStream local_28;
  
  uVar1 = aPoint->x;
  if ((((((int)uVar1 < 1) || (bPoint->x <= (int)(uVar1 ^ 0x7fffffff))) &&
       ((uVar2 = aPoint->y, (int)uVar2 < 1 || (bPoint->y <= (int)(uVar2 ^ 0x7fffffff))))) &&
      ((-1 < (int)uVar1 || ((int)(-0x80000000 - uVar1) <= bPoint->x)))) &&
     ((-1 < (int)uVar2 || ((int)(-0x80000000 - uVar2) <= bPoint->y)))) {
    PVar4.x = uVar1 + bPoint->x;
    PVar4.y = uVar2 + bPoint->y;
  }
  else {
    local_28.data._M_dataplus._M_p = (pointer)&local_28.data.field_2;
    local_28.data.field_2._8_8_ = 0;
    local_28.data._M_string_length = 0;
    local_28.data.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::append((char *)&local_28);
    std::__cxx11::string::append((char *)&local_28);
    std::__cxx11::string::append((char *)&local_28);
    std::__cxx11::string::append((char *)&local_28);
    std::__cxx11::string::append((char *)&local_28);
    pLVar3 = details::LogStream::operator<<(&local_28,0x2a);
    std::__cxx11::string::append((char *)pLVar3);
    std::__cxx11::string::append((char *)pLVar3);
    details::LogStream::~LogStream(&local_28);
    PVar4.x = 0;
    PVar4.y = 0;
  }
  return PVar4;
}

Assistant:

Point operator+(const Point& aPoint, const Point& bPoint)
{
    if ((aPoint.x > 0 && INT32_MAX - aPoint.x < bPoint.x) || (aPoint.y > 0 && INT32_MAX - aPoint.y < bPoint.y) ||
        (aPoint.x < 0 && INT32_MIN - aPoint.x > bPoint.x) || (aPoint.y < 0 && INT32_MIN - aPoint.y > bPoint.y)) {
        ALOG() << "add point is out of range.";
        return {0, 0};
    }
    return {aPoint.x + bPoint.x, aPoint.y + bPoint.y};
}